

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>
 anon_unknown.dwarf_2a1b1f::InferXOnlyPubkey
           (XOnlyPubKey *xkey,ParseScriptContext ctx,SigningProvider *provider)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  pointer __p;
  undefined8 *puVar5;
  undefined8 *puVar6;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  CPubKey pubkey;
  __uniq_ptr_impl<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
  local_a0;
  KeyOriginInfo local_98;
  CPubKey local_71;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  XOnlyPubKey::GetEvenCorrespondingCPubKey
            (&local_71,(XOnlyPubKey *)CONCAT44(in_register_00000034,ctx));
  puVar5 = (undefined8 *)operator_new(0x50);
  *(undefined4 *)(puVar5 + 1) = 0;
  *puVar5 = &PTR__PubkeyProvider_003dc498;
  memcpy((void *)((long)puVar5 + 0xc),&local_71,0x41);
  *(undefined1 *)((long)puVar5 + 0x4d) = 1;
  local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = SigningProvider::GetKeyOriginByXOnly
                    (provider,(XOnlyPubKey *)CONCAT44(in_register_00000034,ctx),&local_98);
  if (bVar4) {
    puVar6 = (undefined8 *)operator_new(0x40);
    puVar3 = local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar2 = local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar1 = local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    *(undefined4 *)(puVar6 + 1) = 0;
    *puVar6 = &PTR__OriginPubkeyProvider_003dc628;
    *(uchar (*) [4])(puVar6 + 2) = local_98.fingerprint;
    puVar6[3] = puVar1;
    puVar6[4] = puVar2;
    puVar6[5] = puVar3;
    puVar6[6] = puVar5;
    *(undefined1 *)(puVar6 + 7) = 0;
    local_a0._M_t.
    super__Tuple_impl<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
    .super__Head_base<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_false>._M_head_impl =
         (tuple<(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
          )(_Tuple_impl<0UL,_(anonymous_namespace)::OriginPubkeyProvider_*,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
            )0x0;
    *(undefined8 **)(xkey->m_keydata).super_base_blob<256U>.m_data._M_elems = puVar6;
    std::
    unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
    ::~unique_ptr((unique_ptr<(anonymous_namespace)::OriginPubkeyProvider,_std::default_delete<(anonymous_namespace)::OriginPubkeyProvider>_>
                   *)&local_a0);
  }
  else {
    *(undefined8 **)(xkey->m_keydata).super_base_blob<256U>.m_data._M_elems = puVar5;
  }
  if (local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.path.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
            )(__uniq_ptr_data<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>,_true,_true>
              )xkey;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<PubkeyProvider> InferXOnlyPubkey(const XOnlyPubKey& xkey, ParseScriptContext ctx, const SigningProvider& provider)
{
    CPubKey pubkey{xkey.GetEvenCorrespondingCPubKey()};
    std::unique_ptr<PubkeyProvider> key_provider = std::make_unique<ConstPubkeyProvider>(0, pubkey, true);
    KeyOriginInfo info;
    if (provider.GetKeyOriginByXOnly(xkey, info)) {
        return std::make_unique<OriginPubkeyProvider>(0, std::move(info), std::move(key_provider), /*apostrophe=*/false);
    }
    return key_provider;
}